

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLParam<int>::Print(CLParam<int> *this)

{
  ostream *poVar1;
  CLParam<int> *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"# ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x30));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"# [Default = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x54));
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PrintSimple(in_RDI);
  return;
}

Assistant:

void Print()
    {
        std::cout << "# " << description << std::endl ;
        std::cout << "# [Default = " << default_value << "]" << std::endl;
        PrintSimple() ;
    }